

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O2

void flag_message(wchar_t flag,char *name)

{
  byte bVar1;
  int iVar2;
  obj_property *poVar3;
  char *pcVar4;
  ushort **ppuVar5;
  char *__s;
  size_t end;
  char *local_440;
  char buf [1024];
  
  local_440 = name;
  poVar3 = lookup_obj_property(L'\x03',flag);
  memset(buf,0,0x400);
  end = 0;
  __s = poVar3->msg;
  if (__s != (char *)0x0) {
    pcVar4 = strchr(__s,0x7b);
    while (pcVar4 != (char *)0x0) {
      strnfcat(buf,0x400,&end,"%.*s",(ulong)(uint)((int)pcVar4 - (int)__s),__s);
      __s = pcVar4 + 1;
      pcVar4 = pcVar4 + 2;
      while( true ) {
        bVar1 = pcVar4[-1];
        if ((ulong)bVar1 == 0) break;
        ppuVar5 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar5 + (ulong)bVar1 * 2 + 1) & 4) == 0) {
          if ((bVar1 == 0x7d) && (iVar2 = strncmp(__s,"name",4), __s = pcVar4, iVar2 == 0)) {
            strnfcat(buf,0x400,&end,"%s",local_440);
          }
          break;
        }
        pcVar4 = pcVar4 + 1;
      }
      pcVar4 = strchr(__s,0x7b);
    }
    strnfcat(buf,0x400,&end,"%s",__s);
    msg("%s",buf);
  }
  return;
}

Assistant:

void flag_message(int flag, char *name)
{
	struct obj_property *prop = lookup_obj_property(OBJ_PROPERTY_FLAG, flag);
	char buf[1024] = "\0";
	const char *next;
	const char *s;
	const char *tag;
	const char *in_cursor;
	size_t end = 0;

	/* See if we have a message */
	if (!prop->msg) return;
	in_cursor = prop->msg;

	next = strchr(in_cursor, '{');
	while (next) {
		/* Copy the text leading up to this { */
		strnfcat(buf, 1024, &end, "%.*s", (int) (next - in_cursor),
			in_cursor);

		s = next + 1;
		while (*s && isalpha((unsigned char) *s)) s++;

		/* Valid tag */
		if (*s == '}') {
			/* Start the tag after the { */
			tag = next + 1;
			in_cursor = s + 1;
			if (strncmp(tag, "name", 4) == 0) {
				strnfcat(buf, 1024, &end, "%s", name); 
			}

		} else {
			/* An invalid tag, skip it */
			in_cursor = next + 1;
		}

		next = strchr(in_cursor, '{');
	}
	strnfcat(buf, 1024, &end, "%s", in_cursor);

	msg("%s", buf);
}